

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

bool chaiscript::detail::Dispatch_Engine::is_attribute_call
               (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                *t_funs,Function_Params *t_params,bool t_has_params,
               Type_Conversions_State *t_conversions)

{
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *psVar1;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  _Var2;
  undefined7 in_register_00000011;
  bool bVar3;
  
  if (((int)CONCAT71(in_register_00000011,t_has_params) == 0) ||
     (t_params->m_begin == t_params->m_end)) {
    bVar3 = false;
  }
  else {
    psVar1 = (t_funs->
             super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,__gnu_cxx::__ops::_Iter_pred<chaiscript::detail::Dispatch_Engine::is_attribute_call(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>const&,chaiscript::Function_Params_const&,bool,chaiscript::Type_Conversions_State_const&)::_lambda(auto:1_const&)_1_>>
                      ((t_funs->
                       super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,psVar1,t_params);
    bVar3 = _Var2._M_current != psVar1;
  }
  return bVar3;
}

Assistant:

static bool is_attribute_call(const std::vector<Proxy_Function> &t_funs,
                                    const Function_Params &t_params,
                                    bool t_has_params,
                                    const Type_Conversions_State &t_conversions) noexcept {
        if (!t_has_params || t_params.empty()) {
          return false;
        }

        return std::any_of(std::begin(t_funs), std::end(t_funs), [&](const auto &fun) {
          return fun->is_attribute_function() && fun->compare_first_type(t_params[0], t_conversions);
        });
      }